

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

double __thiscall Colorf::exp(Colorf *this,double __x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Colorf *this_local;
  
  dVar1 = std::exp((double)(ulong)(uint)this->r);
  dVar2 = std::exp((double)(ulong)(uint)this->g);
  dVar3 = std::exp((double)(ulong)(uint)this->b);
  Colorf((Colorf *)((long)&this_local + 4),SUB84(dVar1,0),SUB84(dVar2,0),SUB84(dVar3,0));
  return stack0xffffffffffffffec;
}

Assistant:

Colorf Colorf::exp() const {
	return Colorf{std::exp(r), std::exp(g), std::exp(b)};
}